

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeSorterJoinThread(SortSubtask *pTask)

{
  SQLiteThread *p;
  int iVar1;
  long in_FS_OFFSET;
  void *pRet;
  void *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  p = pTask->pThread;
  if (p == (SQLiteThread *)0x0) {
    iVar1 = 0;
  }
  else {
    local_20 = (void *)0x1;
    if (p->done == 0) {
      pthread_join(p->tid,&local_20);
    }
    else {
      local_20 = p->pOut;
    }
    sqlite3_free(p);
    pTask->bDone = 0;
    pTask->pThread = (SQLiteThread *)0x0;
    iVar1 = (int)local_20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int vdbeSorterJoinThread(SortSubtask *pTask){
  int rc = SQLITE_OK;
  if( pTask->pThread ){
#ifdef SQLITE_DEBUG_SORTER_THREADS
    int bDone = pTask->bDone;
#endif
    void *pRet = SQLITE_INT_TO_PTR(SQLITE_ERROR);
    vdbeSorterBlockDebug(pTask, !bDone, "enter");
    (void)sqlite3ThreadJoin(pTask->pThread, &pRet);
    vdbeSorterBlockDebug(pTask, !bDone, "exit");
    rc = SQLITE_PTR_TO_INT(pRet);
    assert( pTask->bDone==1 );
    pTask->bDone = 0;
    pTask->pThread = 0;
  }
  return rc;
}